

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O2

void __thiscall sptk::SymmetricMatrix::SymmetricMatrix(SymmetricMatrix *this,int num_dimension)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  this->_vptr_SymmetricMatrix = (_func_int **)&PTR__SymmetricMatrix_0010fd60;
  if (num_dimension < 1) {
    num_dimension = 0;
  }
  this->num_dimension_ = num_dimension;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->data_,(ulong)((uint)(num_dimension * (num_dimension + 1)) >> 1));
  std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_dimension_)
  ;
  uVar2 = 0;
  uVar1 = (ulong)(uint)this->num_dimension_;
  if (this->num_dimension_ < 1) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  while (uVar1 != uVar2) {
    (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] =
         (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + uVar3;
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + (int)uVar2;
  }
  return;
}

Assistant:

SymmetricMatrix::SymmetricMatrix(int num_dimension)
    : num_dimension_(num_dimension < 0 ? 0 : num_dimension) {
  data_.resize(num_dimension_ * (num_dimension_ + 1) / 2);
  index_.resize(num_dimension_);

  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}